

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

void __thiscall Parser::parse_prelude_literal(Parser *this)

{
  int iVar1;
  _Head_base<0UL,_TextProvider_*,_false> _Var2;
  byte bVar3;
  bool bVar4;
  byte bVar5;
  string current_literal_string;
  long *local_98;
  long local_90;
  long local_88 [2];
  long *local_78;
  long local_70;
  long local_68 [2];
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  int local_30;
  
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98);
  if (((this->m_text_provider)._M_t.
       super___uniq_ptr_impl<TextProvider,_std::default_delete<TextProvider>_>._M_t.
       super__Tuple_impl<0UL,_TextProvider_*,_std::default_delete<TextProvider>_>.
       super__Head_base<0UL,_TextProvider_*,_false>._M_head_impl)->m_current_char != ' ') {
    std::__cxx11::string::push_back((char)&local_98);
  }
  bVar5 = 1;
  while( true ) {
    bVar3 = (**(code **)((long)((this->m_text_provider)._M_t.
                                super___uniq_ptr_impl<TextProvider,_std::default_delete<TextProvider>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_TextProvider_*,_std::default_delete<TextProvider>_>
                                .super__Head_base<0UL,_TextProvider_*,_false>._M_head_impl)->
                               _vptr_TextProvider + 0x10))();
    if ((bVar3 & bVar5) != 1) break;
    (**(code **)((long)((this->m_text_provider)._M_t.
                        super___uniq_ptr_impl<TextProvider,_std::default_delete<TextProvider>_>._M_t
                        .super__Tuple_impl<0UL,_TextProvider_*,_std::default_delete<TextProvider>_>.
                        super__Head_base<0UL,_TextProvider_*,_false>._M_head_impl)->
                       _vptr_TextProvider + 0x18))();
    bVar4 = try_parse_return(this,false);
    _Var2._M_head_impl =
         (this->m_text_provider)._M_t.
         super___uniq_ptr_impl<TextProvider,_std::default_delete<TextProvider>_>._M_t.
         super__Tuple_impl<0UL,_TextProvider_*,_std::default_delete<TextProvider>_>.
         super__Head_base<0UL,_TextProvider_*,_false>._M_head_impl;
    if (bVar4) {
      bVar5 = 0;
      (**(code **)((long)(_Var2._M_head_impl)->_vptr_TextProvider + 0x20))();
    }
    else if ((_Var2._M_head_impl)->m_current_char == '(') {
      parse_comment(this,0);
    }
    else {
      std::__cxx11::string::push_back((char)&local_98);
    }
  }
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char*>((string *)&local_78,local_98,local_90 + (long)local_98);
  iVar1 = this->m_line_counter;
  local_58._0_4_ = Literal;
  local_50._M_p = (pointer)&local_40;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_78,local_70 + (long)local_78);
  local_30 = iVar1;
  std::
  vector<Token<ParsedGame::PreludeTokenType>,std::allocator<Token<ParsedGame::PreludeTokenType>>>::
  emplace_back<Token<ParsedGame::PreludeTokenType>>
            ((vector<Token<ParsedGame::PreludeTokenType>,std::allocator<Token<ParsedGame::PreludeTokenType>>>
              *)&this->m_parsed_game,(Token<ParsedGame::PreludeTokenType> *)local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_p != &local_40) {
    operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  return;
}

Assistant:

void Parser::parse_prelude_literal()
{
	string current_literal_string = "";
	if(m_text_provider->get_current_char() != ' ')
	{
		current_literal_string.push_back(m_text_provider->get_current_char());
	}

	bool detected_literal_end = false;
	while(m_text_provider->is_valid() && !detected_literal_end)
	{
		m_text_provider->advance();
		if(try_parse_return(false))
		{
			detected_literal_end = true;
			m_text_provider->reverse();
		}
		else
		{
			switch(m_text_provider->get_current_char())
			{
				case '(':
					parse_comment();
					break;
				default:
					current_literal_string.push_back(m_text_provider->get_current_char());
				break;
			}
		}
	}

	m_parsed_game.prelude_tokens.push_back(Token<ParsedGame::PreludeTokenType>(ParsedGame::PreludeTokenType::Literal,current_literal_string, m_line_counter));
}